

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_node<std::ostream>(IsoTree *node,basic_ostream<char,_std::char_traits<char>_> *out)

{
  size_type sVar1;
  char *ptr;
  long in_RDI;
  size_t data_sizets [4];
  double data_doubles [6];
  uint8_t data_en;
  size_t in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  
  if (!interrupt_switch) {
    write_bytes<unsigned_char>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(ostream *)0x65bfbe);
    write_bytes<int>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(ostream *)0x65bfd6);
    write_bytes<double>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(ostream *)0x65c04a);
    std::vector<signed_char,_std::allocator<signed_char>_>::size
              ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x18));
    write_bytes<unsigned_long>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(ostream *)0x65c09b);
    sVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x18));
    if (sVar1 != 0) {
      ptr = std::vector<signed_char,_std::allocator<signed_char>_>::data
                      ((vector<signed_char,_std::allocator<signed_char>_> *)0x65c0bd);
      std::vector<signed_char,_std::allocator<signed_char>_>::size
                ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x18));
      write_bytes<signed_char>(ptr,in_stack_ffffffffffffff88,(ostream *)0x65c0e2);
    }
  }
  return;
}

Assistant:

void serialize_node(const IsoTree &node, otype &out)
{
    if (interrupt_switch) return;
    
    uint8_t data_en = (uint8_t)node.col_type;
    write_bytes<uint8_t>((void*)&data_en, (size_t)1, out);

    write_bytes<int>((void*)&node.chosen_cat, (size_t)1, out);

    double data_doubles[] = {
        node.num_split,
        node.pct_tree_left,
        node.score,
        node.range_low,
        node.range_high,
        node.remainder
    };
    write_bytes<double>((void*)data_doubles, (size_t)6, out);

    size_t data_sizets[] = {
        node.col_num,
        node.tree_left,
        node.tree_right,
        node.cat_split.size()
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)4, out);

    if (node.cat_split.size())
    write_bytes<signed char>((void*)node.cat_split.data(), node.cat_split.size(), out);
}